

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O3

CharFormat testing::internal::PrintCharsAsStringTo<char16_t>(char16_t *begin,size_t len,ostream *os)

{
  char16_t cVar1;
  int iVar2;
  CharFormat CVar3;
  ostream *poVar4;
  size_t sVar5;
  bool bVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"u",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  if (len != 0) {
    bVar6 = false;
    sVar5 = 0;
    do {
      cVar1 = begin[sVar5];
      if ((bool)((ushort)cVar1 < 0x100 & bVar6)) {
        iVar2 = isxdigit((uint)(ushort)cVar1);
        if (iVar2 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\" ",2);
          std::__ostream_insert<char,std::char_traits<char>>(os,"u",1);
          std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
        }
      }
      CVar3 = PrintAsStringLiteralTo((uint)(ushort)cVar1,os);
      bVar6 = CVar3 == kHexEscape;
      sVar5 = sVar5 + 1;
    } while (len != sVar5);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  return (CharFormat)poVar4;
}

Assistant:

static CharFormat PrintCharsAsStringTo(
    const CharType* begin, size_t len, ostream* os) {
  const char* const quote_prefix = GetCharWidthPrefix(*begin);
  *os << quote_prefix << "\"";
  bool is_previous_hex = false;
  CharFormat print_format = kAsIs;
  for (size_t index = 0; index < len; ++index) {
    const CharType cur = begin[index];
    if (is_previous_hex && IsXDigit(cur)) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" " << quote_prefix << "\"";
    }
    is_previous_hex = PrintAsStringLiteralTo(cur, os) == kHexEscape;
    // Remember if any characters required hex escaping.
    if (is_previous_hex) {
      print_format = kHexEscape;
    }
  }
  *os << "\"";
  return print_format;
}